

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall cmOrderDirectories::FindConflicts(cmOrderDirectories *this)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  reference ppcVar4;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar5;
  iterator __first;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_70;
  const_iterator local_68;
  const_iterator local_60;
  pair<int,_int> *local_50;
  pair<int,_int> *local_48;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_40;
  iterator last;
  __normal_iterator<cmOrderDirectories::ConflictList_*,_std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>_>
  local_28;
  __normal_iterator<cmOrderDirectories::ConflictList_*,_std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>_>
  local_20;
  iterator i_1;
  uint i;
  cmOrderDirectories *this_local;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->OriginalDirectories);
  std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>::
  resize(&this->ConflictGraph,sVar2);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->OriginalDirectories);
  i_1._M_current._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->DirectoryVisited,sVar2,(value_type_conflict2 *)((long)&i_1._M_current + 4));
  i_1._M_current._0_4_ = 0;
  while( true ) {
    uVar3 = (ulong)(uint)i_1._M_current;
    sVar2 = std::
            vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
            ::size(&this->ConstraintEntries);
    if (sVar2 <= uVar3) break;
    ppcVar4 = std::
              vector<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
              ::operator[](&this->ConstraintEntries,(ulong)(uint)i_1._M_current);
    cmOrderDirectoriesConstraint::FindConflicts(*ppcVar4,(uint)i_1._M_current);
    i_1._M_current._0_4_ = (uint)i_1._M_current + 1;
  }
  local_20._M_current =
       (ConflictList *)
       std::
       vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>::
       begin(&this->ConflictGraph);
  while( true ) {
    local_28._M_current =
         (ConflictList *)
         std::
         vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>
         ::end(&this->ConflictGraph);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pvVar5 = &__gnu_cxx::
              __normal_iterator<cmOrderDirectories::ConflictList_*,_std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>_>
              ::operator->(&local_20)->
              super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>;
    __first = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(pvVar5)
    ;
    pvVar5 = &__gnu_cxx::
              __normal_iterator<cmOrderDirectories::ConflictList_*,_std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>_>
              ::operator->(&local_20)->
              super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>;
    last = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(pvVar5);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )__first._M_current,
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )last._M_current);
    pvVar5 = &__gnu_cxx::
              __normal_iterator<cmOrderDirectories::ConflictList_*,_std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>_>
              ::operator->(&local_20)->
              super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>;
    local_48 = (pair<int,_int> *)
               std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         (pvVar5);
    pvVar5 = &__gnu_cxx::
              __normal_iterator<cmOrderDirectories::ConflictList_*,_std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>_>
              ::operator->(&local_20)->
              super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>;
    local_50 = (pair<int,_int> *)
               std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(pvVar5);
    local_40 = std::
               unique<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,cmOrderDirectoriesCompare>
                         (local_48,local_50);
    pvVar5 = &__gnu_cxx::
              __normal_iterator<cmOrderDirectories::ConflictList_*,_std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>_>
              ::operator->(&local_20)->
              super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>;
    __gnu_cxx::
    __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
    ::__normal_iterator<std::pair<int,int>*>
              ((__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                *)&local_60,&local_40);
    this_00 = &__gnu_cxx::
               __normal_iterator<cmOrderDirectories::ConflictList_*,_std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>_>
               ::operator->(&local_20)->
               super_vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>;
    local_70._M_current =
         (pair<int,_int> *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(this_00);
    __gnu_cxx::
    __normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
    ::__normal_iterator<std::pair<int,int>*>
              ((__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>
                *)&local_68,&local_70);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::erase
              (pvVar5,local_60,local_68);
    __gnu_cxx::
    __normal_iterator<cmOrderDirectories::ConflictList_*,_std::vector<cmOrderDirectories::ConflictList,_std::allocator<cmOrderDirectories::ConflictList>_>_>
    ::operator++(&local_20);
  }
  FindImplicitConflicts(this);
  return;
}

Assistant:

void cmOrderDirectories::FindConflicts()
{
  // Allocate the conflict graph.
  this->ConflictGraph.resize(this->OriginalDirectories.size());
  this->DirectoryVisited.resize(this->OriginalDirectories.size(), 0);

  // Find directories conflicting with each entry.
  for (unsigned int i = 0; i < this->ConstraintEntries.size(); ++i) {
    this->ConstraintEntries[i]->FindConflicts(i);
  }

  // Clean up the conflict graph representation.
  for (std::vector<ConflictList>::iterator i = this->ConflictGraph.begin();
       i != this->ConflictGraph.end(); ++i) {
    // Sort the outgoing edges for each graph node so that the
    // original order will be preserved as much as possible.
    std::sort(i->begin(), i->end());

    // Make the edge list unique so cycle detection will be reliable.
    ConflictList::iterator last =
      std::unique(i->begin(), i->end(), cmOrderDirectoriesCompare());
    i->erase(last, i->end());
  }

  // Check items in implicit link directories.
  this->FindImplicitConflicts();
}